

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

void validate_symmetric_distances(Instance *instance)

{
  _Bool _Var1;
  int iVar2;
  double a;
  double b;
  double d2;
  double d1;
  int local_18;
  int32_t j;
  int32_t i;
  int32_t n;
  Instance *instance_local;
  
  iVar2 = instance->num_customers + 1;
  local_18 = 0;
  do {
    if (iVar2 <= local_18) {
      return;
    }
    for (d1._4_4_ = 0; d1._4_4_ < iVar2; d1._4_4_ = d1._4_4_ + 1) {
      a = cptp_dist(instance,local_18,d1._4_4_);
      b = cptp_dist(instance,d1._4_4_,local_18);
      _Var1 = feq(a,b,1e-05);
      if (!_Var1) {
        __assert_fail("feq(d1, d2, 1e-5)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0x24,"void validate_symmetric_distances(const Instance *)");
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void validate_symmetric_distances(const Instance *instance) {
#ifndef NDEBUG
    const int32_t n = instance->num_customers + 1;

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = 0; j < n; j++) {
            double d1 = cptp_dist(instance, i, j);
            double d2 = cptp_dist(instance, j, i);
            assert(feq(d1, d2, 1e-5));
        }
    }
#else
    UNUSED_PARAM(instance);
#endif
}